

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  size_t n;
  ulong uVar6;
  ulong extraout_RAX;
  ulong uVar7;
  anon_enum_32 extraout_EDX;
  anon_enum_32 aVar8;
  cmdline_key_action *pcVar9;
  char **ppcVar10;
  keyact action;
  keyact kVar11;
  char *local_48;
  char *local_40;
  FILE *local_38;
  
  progname = *argv;
  kVar11 = KEYACT_AGENT_LOAD;
  if (1 < argc) {
    bVar1 = true;
    local_38 = (FILE *)0x0;
    local_48 = (char *)0x0;
    local_40 = (char *)0x0;
LAB_0010bc7f:
    iVar4 = argc + -1;
    ppcVar10 = argv + 1;
    pcVar5 = argv[1];
    action = kVar11;
    if ((*pcVar5 == '-') && (bVar1)) {
      iVar3 = strcmp(pcVar5,"-V");
      if ((iVar3 == 0) || (iVar3 = strcmp(pcVar5,"--version"), iVar3 == 0)) {
        pcVar5 = buildinfo("\n");
        printf("pageant: %s\n%s\n","Unidentified build",pcVar5);
        safefree(pcVar5);
        exit(0);
      }
      iVar3 = strcmp(pcVar5,"--help");
      if (iVar3 == 0) {
        usage();
        goto LAB_0010c37e;
      }
      iVar3 = strcmp(pcVar5,"-v");
      if (iVar3 == 0) {
        local_38 = _stderr;
        argc = iVar4;
      }
      else {
        iVar3 = strcmp(pcVar5,"-a");
        if (iVar3 == 0) {
          kVar11 = KEYACT_CLIENT_ADD;
          argc = iVar4;
        }
        else {
          iVar3 = strcmp(pcVar5,"-d");
          if (iVar3 == 0) {
            kVar11 = KEYACT_CLIENT_DEL;
            argc = iVar4;
          }
          else {
            iVar3 = strcmp(pcVar5,"-r");
            if (iVar3 == 0) {
              kVar11 = KEYACT_CLIENT_REENCRYPT;
              argc = iVar4;
            }
            else {
              iVar3 = strcmp(pcVar5,"-s");
              if (iVar3 == 0) {
                shell_type = ADDRTYPE_IPV4;
                argc = iVar4;
              }
              else {
                iVar3 = strcmp(pcVar5,"-c");
                if (iVar3 != 0) {
                  iVar3 = strcmp(pcVar5,"-D");
                  if (iVar3 == 0) {
                    action = KEYACT_CLIENT_DEL_ALL;
                  }
                  else {
                    iVar3 = strcmp(pcVar5,"-R");
                    if (iVar3 == 0) {
                      action = KEYACT_CLIENT_REENCRYPT_ALL;
                    }
                    else {
                      iVar3 = strcmp(pcVar5,"-l");
                      if (iVar3 != 0) {
                        iVar3 = strcmp(pcVar5,"--public");
                        if (iVar3 == 0) {
                          kVar11 = KEYACT_CLIENT_PUBLIC;
                          argc = iVar4;
                        }
                        else {
                          iVar3 = strcmp(pcVar5,"--public-openssh");
                          if ((iVar3 == 0) || (iVar3 = strcmp(pcVar5,"-L"), iVar3 == 0)) {
                            kVar11 = KEYACT_CLIENT_PUBLIC_OPENSSH;
                            argc = iVar4;
                          }
                          else {
                            iVar3 = strcmp(pcVar5,"-X");
                            if (iVar3 == 0) {
                              life = ADDRTYPE_IPV4;
                              argc = iVar4;
                            }
                            else {
                              iVar3 = strcmp(pcVar5,"-T");
                              if (iVar3 == 0) {
                                life = ADDRTYPE_IPV6;
                                argc = iVar4;
                              }
                              else {
                                iVar3 = strcmp(pcVar5,"--no-decrypt");
                                if ((((iVar3 == 0) ||
                                     (iVar3 = strcmp(pcVar5,"-no-decrypt"), iVar3 == 0)) ||
                                    (iVar3 = strcmp(pcVar5,"--no_decrypt"), iVar3 == 0)) ||
                                   (((iVar3 = strcmp(pcVar5,"-no_decrypt"), iVar3 == 0 ||
                                     (iVar3 = strcmp(pcVar5,"--nodecrypt"), iVar3 == 0)) ||
                                    ((iVar3 = strcmp(pcVar5,"-nodecrypt"), iVar3 == 0 ||
                                     ((iVar3 = strcmp(pcVar5,"--encrypted"), iVar3 == 0 ||
                                      (iVar3 = strcmp(pcVar5,"-encrypted"), iVar3 == 0)))))))) {
                                  if (kVar11 == KEYACT_AGENT_LOAD) {
                                    kVar11 = KEYACT_AGENT_LOAD_ENCRYPTED;
                                    argc = iVar4;
                                  }
                                  else {
                                    if (kVar11 != KEYACT_CLIENT_ADD) goto LAB_0010c38d;
                                    kVar11 = KEYACT_CLIENT_ADD_ENCRYPTED;
                                    argc = iVar4;
                                  }
                                }
                                else {
                                  iVar3 = strcmp(pcVar5,"--debug");
                                  if (iVar3 == 0) {
                                    life = ADDRTYPE_LOCAL;
                                    argc = iVar4;
                                    goto LAB_0010bf48;
                                  }
                                  iVar3 = strcmp(pcVar5,"--test-sign");
                                  if (iVar3 == 0) {
                                    sign_flags = 0;
                                  }
                                  else {
                                    _Var2 = strstartswith(pcVar5,"--test-sign-with-flags=");
                                    if (!_Var2) {
                                      iVar3 = strcmp(pcVar5,"--permanent");
                                      if (iVar3 == 0) {
                                        life = ADDRTYPE_NAME;
                                        argc = iVar4;
                                      }
                                      else {
                                        iVar3 = strcmp(pcVar5,"--exec");
                                        if (iVar3 == 0) {
                                          life = CS_ISO8859_4;
                                          if (argc == 2) goto LAB_0010c39a;
                                          ppcVar10 = argv + 2;
                                          argc = 0;
                                          exec_args = ppcVar10;
                                        }
                                        else {
                                          iVar3 = strcmp(pcVar5,"--tty-prompt");
                                          if (iVar3 == 0) {
                                            prompt_type = ADDRTYPE_IPV4;
                                            argc = iVar4;
                                          }
                                          else {
                                            iVar3 = strcmp(pcVar5,"--gui-prompt");
                                            if (iVar3 != 0) {
                                              iVar3 = strcmp(pcVar5,"--askpass");
                                              if (iVar3 == 0) {
                                                if (argc == 2) goto LAB_0010c39f;
                                                local_40 = argv[2];
                                              }
                                              else {
                                                iVar3 = strcmp(pcVar5,"--symlink");
                                                if (iVar3 == 0) {
                                                  if (argc == 2) goto LAB_0010c3b4;
                                                  local_48 = argv[2];
                                                }
                                                else {
                                                  iVar3 = strcmp(pcVar5,"-E");
                                                  if ((iVar3 != 0) &&
                                                     (iVar3 = strcmp(pcVar5,"--fptype"), iVar3 != 0)
                                                     ) {
                                                    iVar3 = strcmp(pcVar5,"--");
                                                    if (iVar3 == 0) {
                                                      bVar1 = false;
                                                      argc = iVar4;
                                                      goto LAB_0010bf48;
                                                    }
                                                    goto LAB_0010c392;
                                                  }
                                                  if (argc == 2) goto LAB_0010c3a4;
                                                  pcVar5 = argv[2];
                                                  iVar4 = strcmp(pcVar5,"md5");
                                                  if ((iVar4 != 0) &&
                                                     (iVar3 = strcmp(pcVar5,"sha256"), iVar3 != 0))
                                                  goto LAB_0010c3ac;
                                                  key_list_fptype = iVar4 == 0;
                                                }
                                              }
                                              ppcVar10 = argv + 2;
                                              argc = argc + -2;
                                              goto LAB_0010bf48;
                                            }
                                            prompt_type = ADDRTYPE_IPV6;
                                            argc = iVar4;
                                          }
                                        }
                                      }
                                      goto LAB_0010bf48;
                                    }
                                    sign_flags = atoi(pcVar5 + 0x17);
                                  }
                                  kVar11 = KEYACT_CLIENT_SIGN;
                                  argc = iVar4;
                                }
                              }
                            }
                          }
                        }
                        goto LAB_0010bf48;
                      }
                      action = KEYACT_CLIENT_LIST;
                    }
                  }
                  pcVar5 = (char *)0x0;
                  goto LAB_0010bf43;
                }
                shell_type = ADDRTYPE_IPV6;
                argc = iVar4;
              }
            }
          }
        }
      }
    }
    else {
LAB_0010bf43:
      add_keyact(action,pcVar5);
      argc = iVar4;
    }
LAB_0010bf48:
    argv = ppcVar10;
    if (argc < 2) goto LAB_0010c209;
    goto LAB_0010bc7f;
  }
  local_40 = (char *)0x0;
  local_48 = (char *)0x0;
  local_38 = (FILE *)0x0;
LAB_0010c209:
  if ((life == CS_ISO8859_4) && (exec_args == (char **)0x0)) {
LAB_0010c37e:
    main_cold_8();
  }
  else {
    if (((display == (char *)0x0) && (display = getenv("DISPLAY"), display != (char *)0x0)) &&
       (*display == '\0')) {
      display = (char *)0x0;
    }
    if (local_40 != (char *)0x0) {
      pcVar5 = askpass(local_40);
      if (pcVar5 != (char *)0x0) {
        puts(pcVar5);
        fflush(_stdout);
        n = strlen(pcVar5);
        smemclr(pcVar5,n);
        safefree(pcVar5);
        return 0;
      }
      return 1;
    }
    putty_signal(0xd,(_func_void_int *)0x1);
    sk_init();
    uxsel_init();
    if (keyact_head == (cmdline_key_action *)0x0) {
      uVar7 = 0;
      uVar6 = 0;
    }
    else {
      uVar6 = 0;
      uVar7 = 0;
      pcVar9 = keyact_head;
      do {
        if (pcVar9->action < KEYACT_CLIENT_ADD) {
          uVar7 = 1;
        }
        else {
          uVar6 = 1;
        }
        pcVar9 = pcVar9->next;
      } while (pcVar9 != (cmdline_key_action *)0x0);
    }
    aVar8 = life;
    if (life != ADDRTYPE_UNSPEC) {
      if (uVar6 == 0) goto LAB_0010c318;
      main_cold_9();
      uVar6 = extraout_RAX;
      aVar8 = extraout_EDX;
    }
    if ((uVar7 & 1) == 0) {
      if (aVar8 != ADDRTYPE_UNSPEC) {
LAB_0010c318:
        run_agent(local_38,local_48);
        return 0;
      }
      if ((uVar6 & 1) != 0) {
        run_client();
        return 0;
      }
      goto LAB_0010c388;
    }
  }
  main_cold_11();
LAB_0010c388:
  main_cold_10();
LAB_0010c38d:
  main_cold_7();
LAB_0010c392:
  main_cold_1();
LAB_0010c39a:
  main_cold_6();
LAB_0010c39f:
  main_cold_5();
LAB_0010c3a4:
  main_cold_3();
LAB_0010c3ac:
  main_cold_2();
LAB_0010c3b4:
  main_cold_4();
  puts("Pageant: SSH agent");
  puts("Unidentified build");
  puts("Usage: pageant <lifetime> [[--encrypted] key files]");
  puts("       pageant [[--encrypted] key files] --exec <command> [args]");
  puts("       pageant -a [--encrypted] [key files]");
  puts("       pageant -d [key identifiers]");
  puts("       pageant -D");
  puts("       pageant -r [key identifiers]");
  puts("       pageant -R");
  puts("       pageant --public [key identifiers]");
  puts("       pageant ( --public-openssh | -L ) [key identifiers]");
  puts("       pageant -l [-E fptype]");
  puts("Lifetime options, for running Pageant as an agent:");
  puts("  -X           run with the lifetime of the X server");
  puts("  -T           run with the lifetime of the controlling tty");
  puts("  --permanent  run permanently");
  puts("  --debug      run in debugging mode, without forking");
  puts("  --exec <command>   run with the lifetime of that command");
  puts("Client options, for talking to an existing agent:");
  puts("  -a           add key(s) to the existing agent");
  puts("  -l           list currently loaded key fingerprints and comments");
  puts("  --public     print public keys in RFC 4716 format");
  puts("  --public-openssh, -L   print public keys in OpenSSH format");
  puts("  -d           delete key(s) from the agent");
  puts("  -D           delete all keys from the agent");
  puts("  -r           re-encrypt keys in the agent (forget cleartext)");
  puts("  -R           re-encrypt all possible keys in the agent");
  puts("Other options:");
  puts("  -v           verbose mode (in agent mode)");
  puts("  -s -c        force POSIX or C shell syntax (in agent mode)");
  puts("  --symlink path   create symlink to socket (in agent mode)");
  puts("  --encrypted  when adding keys, don\'t decrypt");
  puts("  -E alg, --fptype alg   fingerprint type for -l (sha256, md5)");
  puts("  --tty-prompt force tty-based passphrase prompt");
  puts("  --gui-prompt force GUI-based passphrase prompt");
  puts("  --askpass <prompt>   behave like a standalone askpass program");
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
    bool doing_opts = true;
    keyact curr_keyact = KEYACT_AGENT_LOAD;
    const char *standalone_askpass_prompt = NULL;
    const char *symlink_path = NULL;
    FILE *logfp = NULL;

    progname = argv[0];

    /*
     * Process the command line.
     */
    while (--argc > 0) {
        char *p = *++argv;
        if (*p == '-' && doing_opts) {
            if (!strcmp(p, "-V") || !strcmp(p, "--version")) {
                version();
            } else if (!strcmp(p, "--help")) {
                usage();
                exit(0);
            } else if (!strcmp(p, "-v")) {
                logfp = stderr;
            } else if (!strcmp(p, "-a")) {
                curr_keyact = KEYACT_CLIENT_ADD;
            } else if (!strcmp(p, "-d")) {
                curr_keyact = KEYACT_CLIENT_DEL;
            } else if (!strcmp(p, "-r")) {
                curr_keyact = KEYACT_CLIENT_REENCRYPT;
            } else if (!strcmp(p, "-s")) {
                shell_type = SHELL_SH;
            } else if (!strcmp(p, "-c")) {
                shell_type = SHELL_CSH;
            } else if (!strcmp(p, "-D")) {
                add_keyact(KEYACT_CLIENT_DEL_ALL, NULL);
            } else if (!strcmp(p, "-R")) {
                add_keyact(KEYACT_CLIENT_REENCRYPT_ALL, NULL);
            } else if (!strcmp(p, "-l")) {
                add_keyact(KEYACT_CLIENT_LIST, NULL);
            } else if (!strcmp(p, "--public")) {
                curr_keyact = KEYACT_CLIENT_PUBLIC;
            } else if (!strcmp(p, "--public-openssh") || !strcmp(p, "-L")) {
                curr_keyact = KEYACT_CLIENT_PUBLIC_OPENSSH;
            } else if (!strcmp(p, "-X")) {
                life = LIFE_X11;
            } else if (!strcmp(p, "-T")) {
                life = LIFE_TTY;
            } else if (!strcmp(p, "--no-decrypt") ||
                       !strcmp(p, "-no-decrypt") ||
                       !strcmp(p, "--no_decrypt") ||
                       !strcmp(p, "-no_decrypt") ||
                       !strcmp(p, "--nodecrypt") ||
                       !strcmp(p, "-nodecrypt") ||
                       !strcmp(p, "--encrypted") ||
                       !strcmp(p, "-encrypted")) {
                if (curr_keyact == KEYACT_AGENT_LOAD)
                    curr_keyact = KEYACT_AGENT_LOAD_ENCRYPTED;
                else if (curr_keyact == KEYACT_CLIENT_ADD)
                    curr_keyact = KEYACT_CLIENT_ADD_ENCRYPTED;
                else {
                    fprintf(stderr, "pageant: unexpected -E while not adding "
                            "keys\n");
                    exit(1);
                }
            } else if (!strcmp(p, "--debug")) {
                life = LIFE_DEBUG;
            } else if (!strcmp(p, "--test-sign")) {
                curr_keyact = KEYACT_CLIENT_SIGN;
                sign_flags = 0;
            } else if (strstartswith(p, "--test-sign-with-flags=")) {
                curr_keyact = KEYACT_CLIENT_SIGN;
                sign_flags = atoi(p + strlen("--test-sign-with-flags="));
            } else if (!strcmp(p, "--permanent")) {
                life = LIFE_PERM;
            } else if (!strcmp(p, "--exec")) {
                life = LIFE_EXEC;
                /* Now all subsequent arguments go to the exec command. */
                if (--argc > 0) {
                    exec_args = ++argv;
                    argc = 0;          /* force end of option processing */
                } else {
                    fprintf(stderr, "pageant: expected a command "
                            "after --exec\n");
                    exit(1);
                }
            } else if (!strcmp(p, "--tty-prompt")) {
                prompt_type = PROMPT_TTY;
            } else if (!strcmp(p, "--gui-prompt")) {
                prompt_type = PROMPT_GUI;
            } else if (!strcmp(p, "--askpass")) {
                if (--argc > 0) {
                    standalone_askpass_prompt = *++argv;
                } else {
                    fprintf(stderr, "pageant: expected a prompt message "
                            "after --askpass\n");
                    exit(1);
                }
            } else if (!strcmp(p, "--symlink")) {
                if (--argc > 0) {
                    symlink_path = *++argv;
                } else {
                    fprintf(stderr, "pageant: expected a pathname "
                            "after --symlink\n");
                    exit(1);
                }
            } else if (!strcmp(p, "-E") || !strcmp(p, "--fptype")) {
                const char *keyword;
                if (--argc > 0) {
                    keyword = *++argv;
                } else {
                    fprintf(stderr, "pageant: expected a type string "
                            "after %s\n", p);
                    exit(1);
                }
                if (!strcmp(keyword, "md5"))
                    key_list_fptype = SSH_FPTYPE_MD5;
                else if (!strcmp(keyword, "sha256"))
                    key_list_fptype = SSH_FPTYPE_SHA256;
                else {
                    fprintf(stderr, "pageant: unknown fingerprint type `%s'\n",
                            keyword);
                    exit(1);
                }
            } else if (!strcmp(p, "--")) {
                doing_opts = false;
            } else {
                fprintf(stderr, "pageant: unrecognised option '%s'\n", p);
                exit(1);
            }
        } else {
            /*
             * Non-option arguments (apart from those after --exec,
             * which are treated specially above) are interpreted as
             * the names of private key files to either add or delete
             * from an agent.
             */
            add_keyact(curr_keyact, p);
        }
    }

    if (life == LIFE_EXEC && !exec_args) {
        fprintf(stderr, "pageant: expected a command with --exec\n");
        exit(1);
    }

    if (!display) {
        display = getenv("DISPLAY");
        if (display && !*display)
            display = NULL;
    }

    /*
     * Deal with standalone-askpass mode.
     */
    if (standalone_askpass_prompt) {
        char *passphrase = askpass(standalone_askpass_prompt);

        if (!passphrase)
            return 1;

        puts(passphrase);
        fflush(stdout);

        smemclr(passphrase, strlen(passphrase));
        sfree(passphrase);
        return 0;
    }

    /*
     * Block SIGPIPE, so that we'll get EPIPE individually on
     * particular network connections that go wrong.
     */
    putty_signal(SIGPIPE, SIG_IGN);

    sk_init();
    uxsel_init();

    /*
     * Now distinguish our two main running modes. Either we're
     * actually starting up an agent, in which case we should have a
     * lifetime mode, and no key actions of KEYACT_CLIENT_* type; or
     * else we're contacting an existing agent to add or remove keys,
     * in which case we should have no lifetime mode, and no key
     * actions of KEYACT_AGENT_* type.
     */
    {
        bool has_agent_actions = false;
        bool has_client_actions = false;
        bool has_lifetime = false;
        const struct cmdline_key_action *act;

        for (act = keyact_head; act; act = act->next) {
            if (is_agent_action(act->action))
                has_agent_actions = true;
            else
                has_client_actions = true;
        }
        if (life != LIFE_UNSPEC)
            has_lifetime = true;

        if (has_lifetime && has_client_actions) {
            fprintf(stderr, "pageant: client key actions (-a, -d, -D, -r, -R, "
                    "-l, -L) do not go with an agent lifetime option\n");
            exit(1);
        }
        if (!has_lifetime && has_agent_actions) {
            fprintf(stderr, "pageant: expected an agent lifetime option with"
                    " bare key file arguments\n");
            exit(1);
        }
        if (!has_lifetime && !has_client_actions) {
            fprintf(stderr, "pageant: expected an agent lifetime option"
                    " or a client key action\n");
            exit(1);
        }

        if (has_lifetime) {
            run_agent(logfp, symlink_path);
        } else if (has_client_actions) {
            run_client();
        }
    }

    return 0;
}